

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_jit_compile.c
# Opt level: O3

PCRE2_SPTR16
compile_ref_iterator_matchingpath(compiler_common *common,PCRE2_SPTR16 cc,backtrack_common *parent)

{
  PCRE2_UCHAR16 PVar1;
  ushort uVar2;
  sljit_compiler *psVar3;
  sljit_compiler *psVar4;
  int iVar5;
  sljit_s32 sVar6;
  backtrack_common *pbVar7;
  sljit_jump *psVar8;
  stub_list *psVar9;
  sljit_label *psVar10;
  sljit_u8 *psVar11;
  sljit_jump *psVar12;
  sljit_jump *psVar13;
  sljit_jump *psVar14;
  backtrack_common *pbVar15;
  jump_list *pjVar16;
  uint uVar17;
  ulong uVar18;
  ushort uVar19;
  uint uVar20;
  sljit_sw sVar21;
  sljit_jump *local_70;
  ulong local_50;
  ushort *local_38;
  
  psVar3 = common->compiler;
  if (psVar3->error != 0) {
    return (PCRE2_SPTR16)0x0;
  }
  PVar1 = *cc;
  pbVar7 = (backtrack_common *)ensure_abuf(psVar3,0x30);
  uVar17 = 0;
  if (psVar3->error != 0) {
    return (PCRE2_SPTR16)0x0;
  }
  uVar19 = PVar1 - 0x71;
  pbVar7->cc = (PCRE2_SPTR16)0x0;
  pbVar7[1].prev = (backtrack_common *)0x0;
  pbVar7->top = (backtrack_common *)0x0;
  pbVar7->topbacktracks = (jump_list *)0x0;
  pbVar7->prev = (backtrack_common *)0x0;
  pbVar7->nextbacktracks = (jump_list *)0x0;
  pbVar7->prev = parent->top;
  pbVar7->cc = cc;
  parent->top = pbVar7;
  local_38 = cc + 1;
  if (uVar19 < 2) {
    uVar17 = (uint)cc[1] * 2;
    local_38 = cc;
  }
  uVar2 = local_38[2];
  local_50 = 0;
  uVar18 = (ulong)uVar17;
  switch(uVar2) {
  case 0x62:
  case 99:
    local_38 = local_38 + 3;
  default:
    uVar17 = 0;
    break;
  case 100:
  case 0x65:
    local_38 = local_38 + 3;
    uVar17 = 0;
    local_50 = 1;
    if ((uVar2 & 1) != 0) goto LAB_00112e15;
    goto LAB_0011302c;
  case 0x66:
  case 0x67:
    uVar17 = 1;
    local_38 = local_38 + 3;
    break;
  case 0x68:
  case 0x69:
    local_50 = (ulong)local_38[3];
    uVar17 = (uint)local_38[4];
    local_38 = local_38 + 5;
  }
  if ((uVar2 & 1) != 0) {
LAB_00112e15:
    psVar4 = common->compiler;
    sljit_emit_op2(psVar4,0x62,0xc,0,0xc,0,0x40,(ulong)(1 < uVar19) * 8 + 0x10);
    psVar8 = sljit_emit_cmp(psVar4,2,0xc,0,0xb,0);
    psVar4 = common->compiler;
    if ((psVar4->error == 0) &&
       (psVar9 = (stub_list *)ensure_abuf(psVar4,0x18), psVar9 != (stub_list *)0x0)) {
      psVar9->start = psVar8;
      psVar10 = sljit_emit_label(psVar4);
      psVar9->quit = psVar10;
      psVar9->next = common->stubs;
      common->stubs = psVar9;
    }
    sVar6 = psVar3->error;
    if (uVar19 < 2) {
      if (sVar6 == 0) {
        iVar5 = common->ovector_start;
        psVar3->mode32 = 0;
        psVar11 = emit_x86_instruction(psVar3,1,1,0,0x8e,(long)iVar5 + uVar18 * 8);
        if (psVar11 != (sljit_u8 *)0x0) {
          *psVar11 = 0x8b;
          sVar6 = psVar3->error;
          goto LAB_00112f0b;
        }
        if (psVar3->error != 0) goto LAB_00112f38;
        goto LAB_00112f0f;
      }
    }
    else {
LAB_00112f0b:
      if (sVar6 == 0) {
LAB_00112f0f:
        psVar3->mode32 = 0;
        psVar11 = emit_x86_instruction(psVar3,1,0x40,0,0x8c,0);
        if (psVar11 != (sljit_u8 *)0x0) {
          *psVar11 = 199;
        }
      }
    }
LAB_00112f38:
    if ((uVar2 != 99) && (psVar3->error == 0)) {
      psVar3->mode32 = 0;
      psVar11 = emit_x86_instruction(psVar3,1,0x40,0,0x8c,8);
      if (psVar11 != (sljit_u8 *)0x0) {
        *psVar11 = 199;
      }
    }
    if ((uint)local_50 == 0) {
      if (uVar19 < 2) {
        sVar21 = (long)common->ovector_start + uVar18 * 8 + 8;
        sVar6 = 0x8e;
      }
      else {
        compile_dnref_search(common,(PCRE2_SPTR16)(ulong)cc[1],(jump_list **)(ulong)cc[2]);
        if (psVar3->error == 0) {
          psVar3->mode32 = 0;
          psVar11 = emit_x86_instruction(psVar3,1,1,0,0x84,0);
          if (psVar11 != (sljit_u8 *)0x0) {
            *psVar11 = 0x8b;
          }
          if (psVar3->error == 0) {
            psVar3->mode32 = 0;
            psVar11 = emit_x86_instruction(psVar3,1,4,0,0x8c,0x10);
            if (psVar11 != (sljit_u8 *)0x0) {
              *psVar11 = 0x89;
            }
          }
        }
        sVar21 = 8;
        sVar6 = 0x84;
      }
      psVar8 = sljit_emit_cmp(psVar3,0,1,0,sVar6,sVar21);
      if (psVar3->error == 0) {
        psVar3->mode32 = 0;
        psVar11 = emit_x86_instruction(psVar3,1,2,0,0x8c,0);
        if (psVar11 != (sljit_u8 *)0x0) {
          *psVar11 = 0x89;
        }
      }
      psVar12 = sljit_emit_jump(psVar3,0x18);
    }
    else {
      if (uVar19 < 2) {
        psVar8 = sljit_emit_cmp(psVar3,0,1,0,0x8e,(long)common->ovector_start + 8);
        if ((psVar3->error == 0) &&
           (pjVar16 = (jump_list *)ensure_abuf(psVar3,0x10), pjVar16 != (jump_list *)0x0)) {
          pjVar16->next = pbVar7->topbacktracks;
          pjVar16->jump = psVar8;
          pbVar7->topbacktracks = pjVar16;
        }
        sVar21 = (long)common->ovector_start + uVar18 * 8 + 8;
        sVar6 = 0x8e;
      }
      else {
        compile_dnref_search(common,(PCRE2_SPTR16)(ulong)cc[1],(jump_list **)(ulong)cc[2]);
        if (psVar3->error == 0) {
          psVar3->mode32 = 0;
          psVar11 = emit_x86_instruction(psVar3,1,1,0,0x84,0);
          if (psVar11 != (sljit_u8 *)0x0) {
            *psVar11 = 0x8b;
          }
          if (psVar3->error == 0) {
            psVar3->mode32 = 0;
            psVar11 = emit_x86_instruction(psVar3,1,4,0,0x8c,0x10);
            if (psVar11 != (sljit_u8 *)0x0) {
              *psVar11 = 0x89;
            }
          }
        }
        sVar21 = 8;
        sVar6 = 0x84;
      }
      psVar12 = (sljit_jump *)0x0;
      psVar8 = sljit_emit_cmp(psVar3,0,1,0,sVar6,sVar21);
    }
    pbVar15 = (backtrack_common *)sljit_emit_label(psVar3);
    pbVar7[1].prev = pbVar15;
    if (((uVar17 != 0) &&
        (psVar13 = sljit_emit_cmp(psVar3,3,0x8c,8,0x40,(ulong)uVar17), psVar3->error == 0)) &&
       (pjVar16 = (jump_list *)ensure_abuf(psVar3,0x10), pjVar16 != (jump_list *)0x0)) {
      pjVar16->next = pbVar7->topbacktracks;
      pjVar16->jump = psVar13;
      pbVar7->topbacktracks = pjVar16;
    }
    if ((1 < uVar19) && (psVar3->error == 0)) {
      psVar3->mode32 = 0;
      psVar11 = emit_x86_instruction(psVar3,1,4,0,0x8c,0x10);
      if (psVar11 != (sljit_u8 *)0x0) {
        *psVar11 = 0x8b;
      }
    }
    compile_ref_matchingpath(common,cc,&pbVar7->topbacktracks,1,1);
    if (psVar3->error == 0) {
      psVar3->mode32 = 0;
      psVar11 = emit_x86_instruction(psVar3,1,2,0,0x8c,0);
      if (psVar11 != (sljit_u8 *)0x0) {
        *psVar11 = 0x89;
      }
    }
    if ((uint)local_50 < 2) {
      if (uVar17 != 0) {
        sljit_emit_op2(psVar3,0x60,0x8c,8,0x8c,8,0x40,1);
      }
    }
    else {
      if (psVar3->error == 0) {
        psVar3->mode32 = 0;
        psVar11 = emit_x86_instruction(psVar3,1,1,0,0x8c,8);
        if (psVar11 != (sljit_u8 *)0x0) {
          *psVar11 = 0x8b;
        }
      }
      sljit_emit_op2(psVar3,0x60,1,0,1,0,0x40,1);
      if (psVar3->error == 0) {
        psVar3->mode32 = 0;
        psVar11 = emit_x86_instruction(psVar3,1,1,0,0x8c,8);
        if (psVar11 != (sljit_u8 *)0x0) {
          *psVar11 = 0x89;
        }
      }
      psVar13 = sljit_emit_cmp(psVar3,2,1,0,0x40,local_50);
      if ((psVar13 != (sljit_jump *)0x0) &&
         (pbVar7 = pbVar7[1].prev, pbVar7 != (backtrack_common *)0x0)) {
        psVar13->flags = (psVar13->flags & 0xfffffffffffffffcU) + 1;
        (psVar13->u).target = (sljit_uw)pbVar7;
      }
    }
    if ((psVar12 != (sljit_jump *)0x0) &&
       (psVar10 = sljit_emit_label(psVar3), psVar10 != (sljit_label *)0x0)) {
      psVar12->flags = (psVar12->flags & 0xfffffffffffffffcU) + 1;
      (psVar12->u).label = psVar10;
    }
    psVar10 = sljit_emit_label(psVar3);
    if ((psVar8 != (sljit_jump *)0x0) && (psVar10 != (sljit_label *)0x0)) {
      psVar8->flags = (psVar8->flags & 0xfffffffffffffffcU) + 1;
      (psVar8->u).label = psVar10;
    }
    psVar3 = common->compiler;
    iVar5 = psVar3->error;
    goto joined_r0x001135d0;
  }
  if ((int)local_50 == 0) {
    psVar4 = common->compiler;
    sljit_emit_op2(psVar4,0x62,0xc,0,0xc,0,0x40,0x10);
    psVar8 = sljit_emit_cmp(psVar4,2,0xc,0,0xb,0);
    psVar4 = common->compiler;
    if ((psVar4->error == 0) &&
       (psVar9 = (stub_list *)ensure_abuf(psVar4,0x18), psVar9 != (stub_list *)0x0)) {
      psVar9->start = psVar8;
      psVar10 = sljit_emit_label(psVar4);
      psVar9->quit = psVar10;
      psVar9->next = common->stubs;
      common->stubs = psVar9;
    }
    iVar5 = psVar3->error;
    if (uVar19 < 2) {
      if (iVar5 == 0) {
        iVar5 = common->ovector_start;
        psVar3->mode32 = 0;
        psVar11 = emit_x86_instruction(psVar3,1,1,0,0x8e,(long)iVar5 + uVar18 * 8);
        if (psVar11 != (sljit_u8 *)0x0) {
          *psVar11 = 0x8b;
          iVar5 = psVar3->error;
          goto LAB_00112d46;
        }
        if (psVar3->error != 0) goto LAB_00113ad7;
        goto LAB_00112d4a;
      }
LAB_00113ad7:
      sljit_emit_op2(psVar3,0x60,0xc,0,0xc,0,0x40,8);
LAB_00112dc9:
      sVar21 = (long)common->ovector_start + uVar18 * 8 + 8;
      sVar6 = 0x8e;
    }
    else {
LAB_00112d46:
      if (iVar5 == 0) {
LAB_00112d4a:
        psVar3->mode32 = 0;
        psVar11 = emit_x86_instruction(psVar3,1,2,0,0x8c,0);
        if (psVar11 != (sljit_u8 *)0x0) {
          *psVar11 = 0x89;
        }
        if (psVar3->error == 0) {
          psVar3->mode32 = 0;
          psVar11 = emit_x86_instruction(psVar3,1,0x40,0,0x8c,8);
          if (psVar11 != (sljit_u8 *)0x0) {
            *psVar11 = 199;
          }
        }
      }
      sljit_emit_op2(psVar3,0x60,0xc,0,0xc,0,0x40,8);
      if (uVar19 < 2) goto LAB_00112dc9;
      compile_dnref_search(common,(PCRE2_SPTR16)(ulong)cc[1],(jump_list **)(ulong)cc[2]);
      if (psVar3->error == 0) {
        psVar3->mode32 = 0;
        psVar11 = emit_x86_instruction(psVar3,1,1,0,0x84,0);
        if (psVar11 != (sljit_u8 *)0x0) {
          *psVar11 = 0x8b;
        }
        if (psVar3->error == 0) {
          psVar3->mode32 = 0;
          psVar11 = emit_x86_instruction(psVar3,1,4,0,0x8e,0x18);
          if (psVar11 != (sljit_u8 *)0x0) {
            *psVar11 = 0x89;
          }
        }
      }
      sVar21 = 8;
      sVar6 = 0x84;
    }
    local_70 = sljit_emit_cmp(psVar3,0,1,0,sVar6,sVar21);
    local_50 = 0;
    sljit_emit_op2(psVar3,0x62,0xc,0,0xc,0,0x40,8);
  }
  else {
LAB_0011302c:
    psVar4 = common->compiler;
    sljit_emit_op2(psVar4,0x62,0xc,0,0xc,0,0x40,8);
    psVar8 = sljit_emit_cmp(psVar4,2,0xc,0,0xb,0);
    psVar4 = common->compiler;
    if ((psVar4->error == 0) &&
       (psVar9 = (stub_list *)ensure_abuf(psVar4,0x18), psVar9 != (stub_list *)0x0)) {
      psVar9->start = psVar8;
      psVar10 = sljit_emit_label(psVar4);
      psVar9->quit = psVar10;
      psVar9->next = common->stubs;
      common->stubs = psVar9;
    }
    sVar6 = psVar3->error;
    if (uVar19 < 2) {
      if (sVar6 == 0) {
        iVar5 = common->ovector_start;
        psVar3->mode32 = 0;
        psVar11 = emit_x86_instruction(psVar3,1,1,0,0x8e,(long)iVar5 + uVar18 * 8);
        if (psVar11 != (sljit_u8 *)0x0) {
          *psVar11 = 0x8b;
          sVar6 = psVar3->error;
          goto LAB_0011310d;
        }
        if (psVar3->error != 0) goto LAB_00113140;
        goto LAB_00113111;
      }
LAB_00113140:
      psVar8 = sljit_emit_cmp(psVar3,0,1,0,0x8e,(long)common->ovector_start + 8);
      if ((psVar3->error == 0) &&
         (pjVar16 = (jump_list *)ensure_abuf(psVar3,0x10), pjVar16 != (jump_list *)0x0)) {
        pjVar16->next = pbVar7->topbacktracks;
        pjVar16->jump = psVar8;
        pbVar7->topbacktracks = pjVar16;
      }
      sVar21 = (long)common->ovector_start + uVar18 * 8 + 8;
      sVar6 = 0x8e;
    }
    else {
LAB_0011310d:
      if (sVar6 == 0) {
LAB_00113111:
        psVar3->mode32 = 0;
        psVar11 = emit_x86_instruction(psVar3,1,0x40,0,0x8c,0);
        if (psVar11 != (sljit_u8 *)0x0) {
          *psVar11 = 199;
        }
      }
      if (uVar19 < 2) goto LAB_00113140;
      compile_dnref_search(common,(PCRE2_SPTR16)(ulong)cc[1],(jump_list **)(ulong)cc[2]);
      if (psVar3->error == 0) {
        psVar3->mode32 = 0;
        psVar11 = emit_x86_instruction(psVar3,1,1,0,0x84,0);
        if (psVar11 != (sljit_u8 *)0x0) {
          *psVar11 = 0x8b;
        }
        if (psVar3->error == 0) {
          psVar3->mode32 = 0;
          psVar11 = emit_x86_instruction(psVar3,1,4,0,0x8e,0x18);
          if (psVar11 != (sljit_u8 *)0x0) {
            *psVar11 = 0x89;
          }
        }
      }
      sVar21 = 8;
      sVar6 = 0x84;
    }
    local_70 = sljit_emit_cmp(psVar3,0,1,0,sVar6,sVar21);
  }
  uVar20 = (uint)local_50;
  if ((uVar17 >= 2 || uVar20 >= 2) && (psVar3->error == 0)) {
    psVar3->mode32 = 0;
    psVar11 = emit_x86_instruction(psVar3,1,0x40,0,0x8e,0x10);
    if (psVar11 != (sljit_u8 *)0x0) {
      *psVar11 = 199;
    }
  }
  psVar8 = (sljit_jump *)sljit_emit_label(psVar3);
  if ((1 < uVar19) && (psVar3->error == 0)) {
    psVar3->mode32 = 0;
    psVar11 = emit_x86_instruction(psVar3,1,4,0,0x8e,0x18);
    if (psVar11 != (sljit_u8 *)0x0) {
      *psVar11 = 0x8b;
    }
  }
  compile_ref_matchingpath(common,cc,&pbVar7->topbacktracks,0,0);
  if (uVar17 < 2 && uVar20 < 2) {
LAB_0011390c:
    if (uVar17 == 0) {
      psVar4 = common->compiler;
      sljit_emit_op2(psVar4,0x62,0xc,0,0xc,0,0x40,8);
      psVar12 = sljit_emit_cmp(psVar4,2,0xc,0,0xb,0);
      psVar4 = common->compiler;
      if ((psVar4->error == 0) &&
         (psVar9 = (stub_list *)ensure_abuf(psVar4,0x18), psVar9 != (stub_list *)0x0)) {
        psVar9->start = psVar12;
        psVar10 = sljit_emit_label(psVar4);
        psVar9->quit = psVar10;
        psVar9->next = common->stubs;
        common->stubs = psVar9;
      }
      if (psVar3->error == 0) {
        psVar3->mode32 = 0;
        psVar11 = emit_x86_instruction(psVar3,1,2,0,0x8c,0);
        if (psVar11 != (sljit_u8 *)0x0) {
          *psVar11 = 0x89;
        }
      }
      psVar12 = sljit_emit_jump(psVar3,0x18);
      psVar13 = psVar12;
      psVar14 = psVar8;
      goto joined_r0x001139cf;
    }
  }
  else {
    if (psVar3->error == 0) {
      psVar3->mode32 = 0;
      psVar11 = emit_x86_instruction(psVar3,1,1,0,0x8e,0x10);
      if (psVar11 != (sljit_u8 *)0x0) {
        *psVar11 = 0x8b;
      }
    }
    sljit_emit_op2(psVar3,0x60,1,0,1,0,0x40,1);
    if (psVar3->error == 0) {
      psVar3->mode32 = 0;
      psVar11 = emit_x86_instruction(psVar3,1,1,0,0x8e,0x10);
      if (psVar11 != (sljit_u8 *)0x0) {
        *psVar11 = 0x89;
      }
    }
    if (((1 < uVar20) &&
        (psVar12 = sljit_emit_cmp(psVar3,2,1,0,0x40,local_50), psVar8 != (sljit_jump *)0x0)) &&
       (psVar12 != (sljit_jump *)0x0)) {
      psVar12->flags = (psVar12->flags & 0xfffffffffffffffcU) + 1;
      (psVar12->u).label = (sljit_label *)psVar8;
    }
    if (uVar17 < 2) goto LAB_0011390c;
    psVar12 = sljit_emit_cmp(psVar3,3,1,0,0x40,(ulong)uVar17);
    psVar4 = common->compiler;
    sljit_emit_op2(psVar4,0x62,0xc,0,0xc,0,0x40,8);
    psVar13 = sljit_emit_cmp(psVar4,2,0xc,0,0xb,0);
    psVar4 = common->compiler;
    if ((psVar4->error == 0) &&
       (psVar9 = (stub_list *)ensure_abuf(psVar4,0x18), psVar9 != (stub_list *)0x0)) {
      psVar9->start = psVar13;
      psVar10 = sljit_emit_label(psVar4);
      psVar9->quit = psVar10;
      psVar9->next = common->stubs;
      common->stubs = psVar9;
    }
    if (psVar3->error == 0) {
      psVar3->mode32 = 0;
      psVar11 = emit_x86_instruction(psVar3,1,2,0,0x8c,0);
      if (psVar11 != (sljit_u8 *)0x0) {
        *psVar11 = 0x89;
      }
    }
    psVar13 = sljit_emit_jump(psVar3,0x18);
    if ((psVar8 != (sljit_jump *)0x0) && (psVar13 != (sljit_jump *)0x0)) {
      psVar13->flags = (psVar13->flags & 0xfffffffffffffffcU) + 1;
      (psVar13->u).label = (sljit_label *)psVar8;
    }
    psVar8 = (sljit_jump *)sljit_emit_label(psVar3);
    psVar13 = psVar8;
    psVar14 = psVar12;
joined_r0x001139cf:
    if ((psVar14 != (sljit_jump *)0x0) && (psVar13 != (sljit_jump *)0x0)) {
      psVar12->flags = (psVar12->flags & 0xfffffffffffffffcU) + 1;
      (psVar12->u).label = (sljit_label *)psVar8;
    }
  }
  psVar10 = sljit_emit_label(psVar3);
  if ((local_70 != (sljit_jump *)0x0) && (psVar10 != (sljit_label *)0x0)) {
    local_70->flags = (local_70->flags & 0xfffffffffffffffcU) + 1;
    (local_70->u).label = psVar10;
  }
  pbVar15 = (backtrack_common *)sljit_emit_label(psVar3);
  pbVar7[1].prev = pbVar15;
  psVar3 = common->compiler;
  iVar5 = psVar3->error;
joined_r0x001135d0:
  if (iVar5 == 0) {
    psVar3->mode32 = 0;
    psVar11 = emit_x86_instruction(psVar3,0x11,0x40,1,10,0);
    if (psVar11 != (sljit_u8 *)0x0) {
      psVar11[1] = psVar11[1] | 0x28;
    }
  }
  psVar8 = sljit_emit_jump(psVar3,0);
  if ((psVar3->error == 0) &&
     (pjVar16 = (jump_list *)ensure_abuf(psVar3,0x10), pjVar16 != (jump_list *)0x0)) {
    pjVar16->next = common->calllimit;
    pjVar16->jump = psVar8;
    common->calllimit = pjVar16;
  }
  return local_38;
}

Assistant:

static SLJIT_INLINE PCRE2_SPTR compile_ref_iterator_matchingpath(compiler_common *common, PCRE2_SPTR cc, backtrack_common *parent)
{
DEFINE_COMPILER;
BOOL ref = (*cc == OP_REF || *cc == OP_REFI);
backtrack_common *backtrack;
PCRE2_UCHAR type;
int offset = 0;
struct sljit_label *label;
struct sljit_jump *zerolength;
struct sljit_jump *jump = NULL;
PCRE2_SPTR ccbegin = cc;
int min = 0, max = 0;
BOOL minimize;

PUSH_BACKTRACK(sizeof(ref_iterator_backtrack), cc, NULL);

if (ref)
  offset = GET2(cc, 1) << 1;
else
  cc += IMM2_SIZE;
type = cc[1 + IMM2_SIZE];

SLJIT_COMPILE_ASSERT((OP_CRSTAR & 0x1) == 0, crstar_opcode_must_be_even);
minimize = (type & 0x1) != 0;
switch(type)
  {
  case OP_CRSTAR:
  case OP_CRMINSTAR:
  min = 0;
  max = 0;
  cc += 1 + IMM2_SIZE + 1;
  break;
  case OP_CRPLUS:
  case OP_CRMINPLUS:
  min = 1;
  max = 0;
  cc += 1 + IMM2_SIZE + 1;
  break;
  case OP_CRQUERY:
  case OP_CRMINQUERY:
  min = 0;
  max = 1;
  cc += 1 + IMM2_SIZE + 1;
  break;
  case OP_CRRANGE:
  case OP_CRMINRANGE:
  min = GET2(cc, 1 + IMM2_SIZE + 1);
  max = GET2(cc, 1 + IMM2_SIZE + 1 + IMM2_SIZE);
  cc += 1 + IMM2_SIZE + 1 + 2 * IMM2_SIZE;
  break;
  default:
  SLJIT_UNREACHABLE();
  break;
  }

if (!minimize)
  {
  if (min == 0)
    {
    allocate_stack(common, 2);
    if (ref)
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset));
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), STR_PTR, 0);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_IMM, 0);
    /* Temporary release of STR_PTR. */
    OP2(SLJIT_ADD, STACK_TOP, 0, STACK_TOP, 0, SLJIT_IMM, sizeof(sljit_sw));
    /* Handles both invalid and empty cases. Since the minimum repeat,
    is zero the invalid case is basically the same as an empty case. */
    if (ref)
      zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1));
    else
      {
      compile_dnref_search(common, ccbegin, NULL);
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(TMP2), 0);
      OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), POSSESSIVE1, TMP2, 0);
      zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(TMP2), sizeof(sljit_sw));
      }
    /* Restore if not zero length. */
    OP2(SLJIT_SUB, STACK_TOP, 0, STACK_TOP, 0, SLJIT_IMM, sizeof(sljit_sw));
    }
  else
    {
    allocate_stack(common, 1);
    if (ref)
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset));
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), SLJIT_IMM, 0);
    if (ref)
      {
      add_jump(compiler, &backtrack->topbacktracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(1)));
      zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1));
      }
    else
      {
      compile_dnref_search(common, ccbegin, &backtrack->topbacktracks);
      OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(TMP2), 0);
      OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), POSSESSIVE1, TMP2, 0);
      zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(TMP2), sizeof(sljit_sw));
      }
    }

  if (min > 1 || max > 1)
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), POSSESSIVE0, SLJIT_IMM, 0);

  label = LABEL();
  if (!ref)
    OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(SLJIT_SP), POSSESSIVE1);
  compile_ref_matchingpath(common, ccbegin, &backtrack->topbacktracks, FALSE, FALSE);

  if (min > 1 || max > 1)
    {
    OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), POSSESSIVE0);
    OP2(SLJIT_ADD, TMP1, 0, TMP1, 0, SLJIT_IMM, 1);
    OP1(SLJIT_MOV, SLJIT_MEM1(SLJIT_SP), POSSESSIVE0, TMP1, 0);
    if (min > 1)
      CMPTO(SLJIT_LESS, TMP1, 0, SLJIT_IMM, min, label);
    if (max > 1)
      {
      jump = CMP(SLJIT_GREATER_EQUAL, TMP1, 0, SLJIT_IMM, max);
      allocate_stack(common, 1);
      OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), STR_PTR, 0);
      JUMPTO(SLJIT_JUMP, label);
      JUMPHERE(jump);
      }
    }

  if (max == 0)
    {
    /* Includes min > 1 case as well. */
    allocate_stack(common, 1);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), STR_PTR, 0);
    JUMPTO(SLJIT_JUMP, label);
    }

  JUMPHERE(zerolength);
  BACKTRACK_AS(ref_iterator_backtrack)->matchingpath = LABEL();

  count_match(common);
  return cc;
  }

allocate_stack(common, ref ? 2 : 3);
if (ref)
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset));
OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), SLJIT_IMM, 0);
if (type != OP_CRMINSTAR)
  OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_IMM, 0);

if (min == 0)
  {
  /* Handles both invalid and empty cases. Since the minimum repeat,
  is zero the invalid case is basically the same as an empty case. */
  if (ref)
    zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1));
  else
    {
    compile_dnref_search(common, ccbegin, NULL);
    OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(TMP2), 0);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(2), TMP2, 0);
    zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(TMP2), sizeof(sljit_sw));
    }
  /* Length is non-zero, we can match real repeats. */
  OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), STR_PTR, 0);
  jump = JUMP(SLJIT_JUMP);
  }
else
  {
  if (ref)
    {
    add_jump(compiler, &backtrack->topbacktracks, CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(1)));
    zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(SLJIT_SP), OVECTOR(offset + 1));
    }
  else
    {
    compile_dnref_search(common, ccbegin, &backtrack->topbacktracks);
    OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(TMP2), 0);
    OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(2), TMP2, 0);
    zerolength = CMP(SLJIT_EQUAL, TMP1, 0, SLJIT_MEM1(TMP2), sizeof(sljit_sw));
    }
  }

BACKTRACK_AS(ref_iterator_backtrack)->matchingpath = LABEL();
if (max > 0)
  add_jump(compiler, &backtrack->topbacktracks, CMP(SLJIT_GREATER_EQUAL, SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_IMM, max));

if (!ref)
  OP1(SLJIT_MOV, TMP2, 0, SLJIT_MEM1(STACK_TOP), STACK(2));
compile_ref_matchingpath(common, ccbegin, &backtrack->topbacktracks, TRUE, TRUE);
OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(0), STR_PTR, 0);

if (min > 1)
  {
  OP1(SLJIT_MOV, TMP1, 0, SLJIT_MEM1(STACK_TOP), STACK(1));
  OP2(SLJIT_ADD, TMP1, 0, TMP1, 0, SLJIT_IMM, 1);
  OP1(SLJIT_MOV, SLJIT_MEM1(STACK_TOP), STACK(1), TMP1, 0);
  CMPTO(SLJIT_LESS, TMP1, 0, SLJIT_IMM, min, BACKTRACK_AS(ref_iterator_backtrack)->matchingpath);
  }
else if (max > 0)
  OP2(SLJIT_ADD, SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_MEM1(STACK_TOP), STACK(1), SLJIT_IMM, 1);

if (jump != NULL)
  JUMPHERE(jump);
JUMPHERE(zerolength);

count_match(common);
return cc;
}